

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlValidState *pxVar1;
  xmlElementPtr pxVar2;
  bool bVar3;
  xmlElementPtr elemDecl;
  xmlValidStatePtr state;
  xmlElementPtr pxStack_40;
  int extsubset;
  xmlElementPtr eDecl;
  xmlChar *pxStack_30;
  int ret;
  xmlChar *qname_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  eDecl._4_4_ = 1;
  state._4_4_ = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    pxStack_30 = qname;
    qname_local = (xmlChar *)elem;
    elem_local = (xmlNodePtr)doc;
    doc_local = (xmlDocPtr)ctxt;
    if (((0 < ctxt->vstateNr) && (ctxt->vstate != (xmlValidState *)0x0)) &&
       (pxVar1 = ctxt->vstate, pxVar1->elemDecl != (xmlElementPtr)0x0)) {
      pxVar2 = pxVar1->elemDecl;
      switch(pxVar2->etype) {
      case XML_ELEMENT_TYPE_UNDEFINED:
        eDecl._4_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_EMPTY:
        xmlErrValidNode(ctxt,pxVar1->node,XML_DTD_NOT_EMPTY,
                        "Element %s was declared EMPTY this one has content\n",pxVar1->node->name,
                        (xmlChar *)0x0,(xmlChar *)0x0);
        eDecl._4_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_ANY:
        break;
      case XML_ELEMENT_TYPE_MIXED:
        if ((pxVar2->content == (xmlElementContentPtr)0x0) ||
           (pxVar2->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
          eDecl._4_4_ = xmlValidateCheckMixed(ctxt,pxVar2->content,qname);
          if (eDecl._4_4_ != 1) {
            xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxVar1->node,XML_DTD_INVALID_CHILD,
                            "Element %s is not declared in %s list of possible children\n",
                            pxStack_30,pxVar1->node->name,(xmlChar *)0x0);
          }
        }
        else {
          xmlErrValidNode(ctxt,pxVar1->node,XML_DTD_NOT_PCDATA,
                          "Element %s was declared #PCDATA but contains non text nodes\n",
                          pxVar1->node->name,(xmlChar *)0x0,(xmlChar *)0x0);
          eDecl._4_4_ = 0;
        }
        break;
      case XML_ELEMENT_TYPE_ELEMENT:
        if (pxVar1->exec != (xmlRegExecCtxtPtr)0x0) {
          eDecl._4_4_ = xmlRegExecPushString(pxVar1->exec,qname,(void *)0x0);
          if (eDecl._4_4_ == -5) {
            xmlVErrMemory((xmlValidCtxtPtr)doc_local);
            return 0;
          }
          bVar3 = -1 < (int)eDecl._4_4_;
          if (!bVar3) {
            xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxVar1->node,XML_DTD_CONTENT_MODEL,
                            "Element %s content does not follow the DTD, Misplaced %s\n",
                            pxVar1->node->name,pxStack_30,(xmlChar *)0x0);
          }
          eDecl._4_4_ = (uint)bVar3;
        }
      }
    }
    pxStack_40 = xmlValidGetElemDecl((xmlValidCtxtPtr)doc_local,(xmlDocPtr)elem_local,
                                     (xmlNodePtr)qname_local,(int *)((long)&state + 4));
    vstateVPush((xmlValidCtxtPtr)doc_local,pxStack_40,(xmlNodePtr)qname_local);
    ctxt_local._4_4_ = eDecl._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}